

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

int Configcmp(char *_a,char *_b)

{
  int local_2c;
  int x;
  config *b;
  config *a;
  char *_b_local;
  char *_a_local;
  
  local_2c = *(int *)(*(long *)_a + 0x60) - *(int *)(*(long *)_b + 0x60);
  if (local_2c == 0) {
    local_2c = *(int *)(_a + 8) - *(int *)(_b + 8);
  }
  return local_2c;
}

Assistant:

int Configcmp(const char *_a,const char *_b)
{
  const struct config *a = (struct config *) _a;
  const struct config *b = (struct config *) _b;
  int x;
  x = a->rp->index - b->rp->index;
  if( x==0 ) x = a->dot - b->dot;
  return x;
}